

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void __thiscall
wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::walkElementSegment
          (Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *this,
          ElementSegment *segment)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Expression *local_30;
  Expression *expr;
  
  if (*(long *)(segment + 0x20) != 0) {
    walk(this,(Expression **)(segment + 0x28));
  }
  puVar1 = *(undefined8 **)(segment + 0x40);
  for (puVar2 = *(undefined8 **)(segment + 0x38); puVar2 != puVar1; puVar2 = puVar2 + 1) {
    local_30 = (Expression *)*puVar2;
    walk(this,&local_30);
  }
  return;
}

Assistant:

void walkElementSegment(ElementSegment* segment) {
    if (segment->table.is()) {
      walk(segment->offset);
    }
    for (auto* expr : segment->data) {
      walk(expr);
    }
    static_cast<SubType*>(this)->visitElementSegment(segment);
  }